

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool p2t::InScanArea(Point *pa,Point *pb,Point *pc,Point *pd)

{
  double oadc;
  double oadb;
  Point *pd_local;
  Point *pc_local;
  Point *pb_local;
  Point *pa_local;
  
  if ((pa->x - pb->x) * (pd->y - pb->y) + -((pd->x - pb->x) * (pa->y - pb->y)) < -1e-12) {
    if (1e-12 < (pa->x - pc->x) * (pd->y - pc->y) + -((pd->x - pc->x) * (pa->y - pc->y))) {
      pa_local._7_1_ = true;
    }
    else {
      pa_local._7_1_ = false;
    }
  }
  else {
    pa_local._7_1_ = false;
  }
  return pa_local._7_1_;
}

Assistant:

bool InScanArea(const Point& pa, const Point& pb, const Point& pc, const Point& pd)
{
  double oadb = (pa.x - pb.x)*(pd.y - pb.y) - (pd.x - pb.x)*(pa.y - pb.y);
  if (oadb >= -EPSILON) {
    return false;
  }

  double oadc = (pa.x - pc.x)*(pd.y - pc.y) - (pd.x - pc.x)*(pa.y - pc.y);
  if (oadc <= EPSILON) {
    return false;
  }
  return true;
}